

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  cmGeneratorTarget *this_01;
  pointer ppcVar2;
  ImportPropertyMap properties;
  
  for (ppcVar2 = (this->Exports).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar2 !=
      (this->Exports).super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    this_00 = *ppcVar2;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &properties._M_t._M_impl.super__Rb_tree_header._M_header;
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_01 = this_00;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    TVar1 = cmGeneratorTarget::GetType(this_00);
    if (TVar1 != INTERFACE_LIBRARY) {
      SetImportLocationProperty
                ((cmExportBuildFileGenerator *)this_01,config,suffix,this_00,
                 (ImportPropertyMap *)&properties._M_t);
    }
    if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      TVar1 = cmGeneratorTarget::GetType(this_00);
      if (TVar1 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,this_00,
                   (ImportPropertyMap *)&properties._M_t,missingTargets);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,this_00,
                   (ImportPropertyMap *)&properties._M_t,missingTargets);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,this_00,&properties._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&properties._M_t);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  for (std::vector<cmGeneratorTarget*>::const_iterator tei =
         this->Exports.begin();
       tei != this->Exports.end(); ++tei) {
    // Collect import properties for this target.
    cmGeneratorTarget* target = *tei;
    ImportPropertyMap properties;

    if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties,
                                        missingTargets);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties, missingTargets);
      }

      // TOOD: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, target, properties);
    }
  }
}